

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O2

size_t __thiscall GdlPass::TotalNumGlyphSubRanges(GdlPass *this)

{
  pointer ppFVar1;
  pointer ppFVar2;
  size_t sVar3;
  size_t sVar4;
  size_t i;
  long lVar5;
  
  ppFVar1 = (this->m_vpfsmc).
            super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppFVar2 = (this->m_vpfsmc).
            super__Vector_base<FsmMachineClass_*,_std::allocator<FsmMachineClass_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  sVar4 = 0;
  for (lVar5 = 0; (long)ppFVar2 - (long)ppFVar1 >> 3 != lVar5; lVar5 = lVar5 + 1) {
    sVar3 = FsmMachineClass::NumberOfRanges(ppFVar1[lVar5]);
    sVar4 = sVar4 + sVar3;
  }
  return sVar4;
}

Assistant:

size_t GdlPass::TotalNumGlyphSubRanges()
{
	size_t cRanges = 0;
	for (size_t i = 0; i < m_vpfsmc.size(); i++)
		cRanges += m_vpfsmc[i]->NumberOfRanges();

	return cRanges;
}